

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# augmentedmatrix.cpp
# Opt level: O0

bool __thiscall AugmentedMatrix::setAugmentData(AugmentedMatrix *this,fraction *values,int height)

{
  int i;
  int height_local;
  fraction *values_local;
  AugmentedMatrix *this_local;
  
  this->height = height;
  for (i = 0; i < this->height; i = i + 1) {
    *(unkbyte10 *)(this->augment + i) = *(unkbyte10 *)(values + i);
  }
  return true;
}

Assistant:

bool AugmentedMatrix::setAugmentData( fraction *values , int height)
{
    this->height = height;
    for( int i(0) ; i < this->height ; i++)
        augment[i]  = values[i];
    return true;
}